

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

void nn_sock_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_ep *pnVar2;
  nn_list_item *it_00;
  bool bVar3;
  nn_ep *local_58;
  nn_fsm *local_40;
  nn_ep *ep;
  nn_list_item *it;
  nn_sock *sock;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_40 = self;
  if (self == (nn_fsm *)0x0) {
    local_40 = (nn_fsm *)0x0;
  }
  if (src == -2 && type == -3) {
    bVar3 = true;
    if (*(int *)&local_40[1].fn != 2) {
      bVar3 = *(int *)&local_40[1].fn == 3;
    }
    if (!bVar3) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "sock->state == NN_SOCK_STATE_ACTIVE || sock->state == NN_SOCK_STATE_ZOMBIE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
              ,0x36f);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(uint *)(*(long *)&local_40[1].state + 8) & 1) == 0) {
      nn_efd_stop((nn_efd *)((long)&local_40[2].owner + 4));
    }
    if ((*(uint *)(*(long *)&local_40[1].state + 8) & 2) == 0) {
      nn_efd_stop((nn_efd *)&local_40[2].owner);
    }
    ep = (nn_ep *)nn_list_begin((nn_list *)&local_40[3].state);
    while (pnVar2 = (nn_ep *)nn_list_end((nn_list *)&local_40[3].state), ep != pnVar2) {
      if (ep == (nn_ep *)0x0) {
        local_58 = (nn_ep *)0x0;
      }
      else {
        local_58 = (nn_ep *)(ep[-1].addr + 8);
      }
      ep = (nn_ep *)nn_list_next((nn_list *)&local_40[3].state,(nn_list_item *)ep);
      nn_list_erase((nn_list *)&local_40[3].state,&local_58->item);
      it_00 = nn_list_end((nn_list *)&local_40[3].owner);
      nn_list_insert((nn_list *)&local_40[3].owner,&local_58->item,it_00);
      nn_ep_stop(local_58);
    }
    *(undefined4 *)&local_40[1].fn = 4;
  }
  else {
    if (*(int *)&local_40[1].fn != 4) {
      if (*(int *)&local_40[1].fn != 5) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
                (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x3bf);
        fflush(_stderr);
        nn_err_abort();
      }
      if (src != -2 || type != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "src == NN_FSM_ACTION && type == NN_SOCK_ACTION_STOPPED",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x3a8);
        fflush(_stderr);
        nn_err_abort();
      }
      goto LAB_00114e73;
    }
    if (src != 1) {
      return;
    }
    if (type != 1) {
      return;
    }
    nn_list_erase((nn_list *)&local_40[3].owner,(nn_list_item *)((long)srcptr + 0x80));
    nn_ep_term((nn_ep *)srcptr);
    nn_free(srcptr);
  }
  iVar1 = nn_list_empty((nn_list *)&local_40[3].owner);
  if (iVar1 == 0) {
    return;
  }
  iVar1 = nn_list_empty((nn_list *)&local_40[3].state);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_empty (&sock->eps)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
            ,0x39d);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined4 *)&local_40[1].fn = 5;
  if (**(long **)local_40[1].shutdown_fn != 0) {
    (*(code *)**(undefined8 **)local_40[1].shutdown_fn)(local_40[1].shutdown_fn);
    return;
  }
LAB_00114e73:
  (**(code **)(*(long *)local_40[1].shutdown_fn + 8))(local_40[1].shutdown_fn);
  *(undefined4 *)&local_40[1].fn = 6;
  if ((*(uint *)(*(long *)&local_40[1].state + 8) & 1) == 0) {
    nn_efd_term((nn_efd *)((long)&local_40[2].owner + 4));
  }
  if ((*(uint *)(*(long *)&local_40[1].state + 8) & 2) == 0) {
    nn_efd_term((nn_efd *)&local_40[2].owner);
  }
  nn_sem_post((nn_sem *)&local_40[2].ctx);
  return;
}

Assistant:

static void nn_sock_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_list_item *it;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_assert (sock->state == NN_SOCK_STATE_ACTIVE ||
            sock->state == NN_SOCK_STATE_ZOMBIE);

        /*  Close sndfd and rcvfd. This should make any current
            select/poll using SNDFD and/or RCVFD exit. */
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
            nn_efd_stop (&sock->rcvfd);
        }
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
            nn_efd_stop (&sock->sndfd);
        }

        /*  Ask all the associated endpoints to stop. */
        it = nn_list_begin (&sock->eps);
        while (it != nn_list_end (&sock->eps)) {
            ep = nn_cont (it, struct nn_ep, item);
            it = nn_list_next (&sock->eps, it);
            nn_list_erase (&sock->eps, &ep->item);
            nn_list_insert (&sock->sdeps, &ep->item,
                nn_list_end (&sock->sdeps));
            nn_ep_stop (ep);

        }
        sock->state = NN_SOCK_STATE_STOPPING_EPS;
        goto finish2;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING_EPS)) {

        if (!(src == NN_SOCK_SRC_EP && type == NN_EP_STOPPED)) {
            /*  If we got here waiting for EPs to teardown, but src is
                not an EP, then it isn't safe for us to do anything,
                because we just need to wait for the EPs to finish
                up their thing.  Just bail. */
            return;
        }
        /*  Endpoint is stopped. Now we can safely deallocate it. */
        ep = (struct nn_ep*) srcptr;
        nn_list_erase (&sock->sdeps, &ep->item);
        nn_ep_term (ep);
        nn_free (ep);

finish2:
        /*  If all the endpoints are deallocated, we can start stopping
            protocol-specific part of the socket. If there' no stop function
            we can consider it stopped straight away. */
        if (!nn_list_empty (&sock->sdeps))
            return;
        nn_assert (nn_list_empty (&sock->eps));
        sock->state = NN_SOCK_STATE_STOPPING;
        if (!sock->sockbase->vfptr->stop)
            goto finish1;
        sock->sockbase->vfptr->stop (sock->sockbase);
        return;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING)) {

        /*  We get here when the deallocation of the socket was delayed by the
            specific socket type. */
        nn_assert (src == NN_FSM_ACTION && type == NN_SOCK_ACTION_STOPPED);

finish1:
        /*  Protocol-specific part of the socket is stopped.
            We can safely deallocate it. */
        sock->sockbase->vfptr->destroy (sock->sockbase);
        sock->state = NN_SOCK_STATE_FINI;

        /*  Close the event FDs entirely. */
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
            nn_efd_term (&sock->rcvfd);
        }
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
            nn_efd_term (&sock->sndfd);
        }

        /*  Now we can unblock the application thread blocked in
            the nn_close() call. */
        nn_sem_post (&sock->termsem);

        return;
    }

    nn_fsm_bad_state(sock->state, src, type);
}